

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void cmp_C5(void)

{
  byte bVar1;
  
  except = '\0';
  bVar1 = getbyte(pc);
  _AH = RAM[bVar1];
  _AL = acc;
  carry_f = '\x01';
  result_f = '@';
  pc = pc + 1;
  temp1 = _AH;
  update_dyn_p();
  return;
}

Assistant:

void cmp_C5(void) {
    uint flags;
    CLE;
    temp1 = RAM[getbyte(pc)];

    asm("push ax");

    asm("CLC");
    if (!carry_f) asm("STC");

    _AL = acc;
    _AH = temp1;

    asm("cmp AL,AH");
    asm("pushf");
    asm("pop flags");
    asm("pop AX");

    carry_f = (flags & 1) ^ 1;
    result_f = flags & 0xC0;
    result_f ^= 0x40;

    pc++;
    update_dyn_p();
}